

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionArgument.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::FunctionArgument::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionArgument *this,int level)

{
  Expression *pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&value,"null",(allocator *)&local_c0);
  pEVar1 = (this->default_value)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
           .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  if (pEVar1 != (Expression *)0x0) {
    (**(code **)(*(long *)&(pEVar1->super_Statement).super_ASTElement + 0x18))
              (&local_c0,pEVar1,level + 1);
    std::__cxx11::string::operator=((string *)&value,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_a0,(char)level);
  std::operator+(&local_60,&local_a0,"FunctionArgument: ");
  std::operator+(&local_40,&local_60,&this->name);
  std::operator+(&local_c0,&local_40," = ");
  std::operator+(__return_storage_ptr__,&local_c0,&value);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&value);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::FunctionArgument::dump(int level) const {
    std::string value {"null"};
    if (this->default_value) {
        value = this->default_value->dump(level+1);
    }
    return std::string(level, '\t')+ "FunctionArgument: "+this->name + " = "+ value;
}